

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageStack.h
# Opt level: O3

uint __thiscall
PageStack<Memory::MarkContext::MarkCandidate>::Split
          (PageStack<Memory::MarkContext::MarkCandidate> *this,uint targetCount,
          PageStack<Memory::MarkContext::MarkCandidate> **targetStacks)

{
  PageStack<Memory::MarkContext::MarkCandidate> *pPVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ulong uVar5;
  ulong uVar6;
  Chunk *pCVar7;
  Chunk *pCVar8;
  ulong uVar9;
  Chunk *pCVar10;
  undefined1 in_XMM0 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 extraout_XMM0_01 [16];
  undefined1 auVar11 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined8 extraout_XMM1_Qb_01;
  undefined8 extraout_XMM1_Qb_02;
  undefined1 auVar12 [16];
  long lStack_70;
  Chunk *local_68;
  Chunk *targetCurrents [3];
  
  uVar6 = (ulong)targetCount;
  if (2 < targetCount - 1) {
    AssertCount = AssertCount + 1;
    lStack_70 = 0x6f1c45;
    Js::Throw::LogAssert();
    lStack_70 = 0x6f1c55;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    in_XMM1._8_8_ = extraout_XMM1_Qb;
    in_XMM1._0_8_ = extraout_XMM1_Qa;
    *puVar4 = 1;
    lStack_70 = 0x6f1c7d;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0xfa,"(targetCount > 0 && targetCount <= MaxSplitTargets)",
                       "targetCount > 0 && targetCount <= MaxSplitTargets");
    if (!bVar3) goto LAB_006f1f1c;
    *puVar4 = 0;
    in_XMM0 = extraout_XMM0;
  }
  if (targetStacks == (PageStack<Memory::MarkContext::MarkCandidate> **)0x0) {
    AssertCount = AssertCount + 1;
    lStack_70 = 0x6f1ca6;
    Js::Throw::LogAssert();
    lStack_70 = 0x6f1cb6;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    in_XMM1._8_8_ = extraout_XMM1_Qb_00;
    in_XMM1._0_8_ = extraout_XMM1_Qa_00;
    *puVar4 = 1;
    lStack_70 = 0x6f1cde;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0xfb,"(targetStacks)","targetStacks");
    if (!bVar3) goto LAB_006f1f1c;
    *puVar4 = 0;
    in_XMM0 = extraout_XMM0_00;
  }
  pCVar8 = this->currentChunk;
  if (pCVar8 == (Chunk *)0x0) {
    AssertCount = AssertCount + 1;
    lStack_70 = 0x6f1d0c;
    Js::Throw::LogAssert();
    lStack_70 = 0x6f1d1c;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    in_XMM1._8_8_ = extraout_XMM1_Qb_01;
    in_XMM1._0_8_ = extraout_XMM1_Qa_01;
    *puVar4 = 1;
    lStack_70 = 0x6f1d44;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x106,"(chunk != nullptr)","chunk != nullptr");
    if (!bVar3) {
LAB_006f1f1c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    in_XMM0 = extraout_XMM0_01;
  }
  pCVar10 = pCVar8->nextChunk;
  if (targetCount != 0) {
    lStack_70 = 0x6f1d7a;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    in_XMM1._8_8_ = extraout_XMM1_Qb_02;
    in_XMM1._0_8_ = extraout_XMM1_Qa_02;
    uVar9 = 0;
    do {
      if (pCVar10 == (Chunk *)0x0) goto LAB_006f1ee3;
      lStack_70 = 0x6f1d97;
      bVar3 = IsEmpty(targetStacks[uVar9]);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        lStack_70 = 0x6f1da9;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        lStack_70 = 0x6f1dd2;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                           ,0x11a,"(targetStacks[targetIndex]->IsEmpty())",
                           "targetStacks[targetIndex]->IsEmpty()");
        if (!bVar3) goto LAB_006f1f1c;
        *puVar4 = 0;
      }
      lStack_70 = 0x6f1ded;
      Release(targetStacks[uVar9]);
      targetStacks[uVar9]->currentChunk = pCVar10;
      targetStacks[uVar9]->chunkStart = (MarkCandidate *)(pCVar10 + 1);
      targetStacks[uVar9]->chunkEnd = (MarkCandidate *)(pCVar10 + 0x80);
      targetStacks[uVar9]->nextEntry = targetStacks[uVar9]->chunkEnd;
      pPVar1 = targetStacks[uVar9];
      in_XMM0._0_8_ = this->count - 0xfe;
      in_XMM0._8_8_ = this->pageCount - 1;
      this->count = in_XMM0._0_8_;
      this->pageCount = in_XMM0._8_8_;
      pPVar1->pageCount = 1;
      pPVar1->count = 0xfe;
      targetCurrents[uVar9 - 1] = pCVar10;
      uVar9 = uVar9 + 1;
      pCVar10 = pCVar10->nextChunk;
    } while (uVar6 != uVar9);
  }
  uVar9 = uVar6;
  if (pCVar10 != (Chunk *)0x0) {
    auVar11 = pmovsxwq(in_XMM0,0xffffff02);
    auVar12 = pmovzxbq(in_XMM1,0x1fe);
    pCVar7 = pCVar8;
    do {
      pCVar8 = pCVar10;
      pCVar7->nextChunk = pCVar8;
      pCVar10 = pCVar8->nextChunk;
      if ((targetCount != 0) && (pCVar10 != (Chunk *)0x0)) {
        uVar5 = 1;
        do {
          *(Chunk **)((&lStack_70)[uVar5] + 0x18) = pCVar10;
          (&lStack_70)[uVar5] = (long)pCVar10;
          pPVar1 = targetStacks[uVar5 - 1];
          this->count = this->count + auVar11._0_8_;
          this->pageCount = this->pageCount + auVar11._8_8_;
          pPVar1->count = pPVar1->count + auVar12._0_8_;
          pPVar1->pageCount = pPVar1->pageCount + auVar12._8_8_;
          pCVar10 = pCVar10->nextChunk;
          if (uVar6 <= uVar5) break;
          uVar5 = uVar5 + 1;
        } while (pCVar10 != (Chunk *)0x0);
      }
      pCVar7 = pCVar8;
    } while (pCVar10 != (Chunk *)0x0);
  }
LAB_006f1ee3:
  pCVar8->nextChunk = (Chunk *)0x0;
  if ((uint)uVar9 != 0) {
    uVar6 = 0;
    do {
      targetCurrents[uVar6 - 1]->nextChunk = (Chunk *)0x0;
      uVar6 = uVar6 + 1;
    } while ((uVar9 & 0xffffffff) != uVar6);
  }
  return (uint)uVar9;
}

Assistant:

uint PageStack<T>::Split(uint targetCount, __in_ecount(targetCount) PageStack<T> ** targetStacks)
{
    // Split the current stack up to [targetCount + 1] ways.
    // [targetStacks] contains the target stacks and must have [targetCount] elements.

    Assert(targetCount > 0 && targetCount <= MaxSplitTargets);
    Assert(targetStacks);
    __analysis_assume(targetCount <= MaxSplitTargets);

    Chunk * mainCurrent;
    Chunk * targetCurrents[MaxSplitTargets];

    // Do the initial split of first pages for each target stack.
    // During this, if we run out of pages, we will return a value < maxSplit to
    // indicate that the split was less than the maximum possible.

    Chunk * chunk = this->currentChunk;
    Assert(chunk != nullptr);

    // The first chunk is assigned to the main stack, and since it's already there,
    // we just advance to the next chunk and start assigning to each target stack.
    mainCurrent = chunk;
    chunk = chunk->nextChunk;

    uint targetIndex = 0;
    while (targetIndex < targetCount)
    {
        if (chunk == nullptr)
        {
            // No more pages.  Adjust targetCount down to what we were actually able to do.
            // We'll return this number below so the caller knows.
            targetCount = targetIndex;
            break;
        }

        // Target stack should be empty.
        // If it has a free page currently, release it.
        Assert(targetStacks[targetIndex]->IsEmpty());
        targetStacks[targetIndex]->Release();

        targetStacks[targetIndex]->currentChunk = chunk;
        targetStacks[targetIndex]->chunkStart = chunk->entries;
        targetStacks[targetIndex]->chunkEnd = &chunk->entries[EntriesPerChunk];
        targetStacks[targetIndex]->nextEntry = targetStacks[targetIndex]->chunkEnd;

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        this->pageCount--;
        targetStacks[targetIndex]->pageCount = 1;
#endif
#if DBG
        this->count -= EntriesPerChunk;
        targetStacks[targetIndex]->count = EntriesPerChunk;
#endif

        targetCurrents[targetIndex] = chunk;

        chunk = chunk->nextChunk;
        targetIndex++;
    }

    // Loop through the remaining chunks (if any),
    // assigning each chunk to the main chunk and the target chunks in turn,
    // and linking each chunk to the end of the respective list.
    while (true)
    {
        if (chunk == nullptr)
        {
            break;
        }

        mainCurrent->nextChunk = chunk;
        mainCurrent = chunk;

        chunk = chunk->nextChunk;

        targetIndex = 0;
        while (targetIndex < targetCount)
        {
            if (chunk == nullptr)
            {
                break;
            }

            targetCurrents[targetIndex]->nextChunk = chunk;
            targetCurrents[targetIndex] = chunk;

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            this->pageCount--;
            targetStacks[targetIndex]->pageCount++;
#endif
#if DBG
            this->count -= EntriesPerChunk;
            targetStacks[targetIndex]->count += EntriesPerChunk;
#endif

            chunk = chunk->nextChunk;
            targetIndex++;
        }
    }

    // Terminate all the split chunk lists with null
    mainCurrent->nextChunk = nullptr;
    targetIndex = 0;
    while (targetIndex < targetCount)
    {
        targetCurrents[targetIndex]->nextChunk = nullptr;
        targetIndex++;
    }

    // Return the actual split count we were able to do, which may have been lowered above.
    return targetCount;
}